

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall SQVM::ToString(SQVM *this,SQObjectPtr *o,SQObjectPtr *res)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQSharedState *this_00;
  SQTable *pSVar4;
  bool bVar5;
  int iVar6;
  SQChar *pSVar7;
  SQChar *pSVar8;
  SQString *pSVar9;
  SQMetaMethod mm;
  char *__format;
  byte unaff_BPL;
  SQObjectPtr closure;
  SQObjectPtr local_38;
  
  SVar2 = (o->super_SQObject)._type;
  if ((int)SVar2 < 0x8000010) {
    if (SVar2 == OT_BOOL) {
      pSVar7 = SQSharedState::GetScratchPad(this->_sharedstate,6);
      __format = "true";
      if ((o->super_SQObject)._unVal.pTable == (SQTable *)0x0) {
        __format = "false";
      }
      snprintf(pSVar7,6,__format);
    }
    else if (SVar2 == OT_INTEGER) {
      pSVar7 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
      snprintf(pSVar7,0x32,"%lld",(o->super_SQObject)._unVal.pTable);
    }
    else {
      if (SVar2 != OT_FLOAT) goto LAB_0015b1c3;
      pSVar7 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
      snprintf(pSVar7,0x32,"%g",(double)(o->super_SQObject)._unVal.fFloat);
    }
LAB_0015b1fc:
    this_00 = this->_sharedstate;
    pSVar7 = SQSharedState::GetScratchPad(this_00,-1);
    pSVar9 = SQString::Create(this_00,pSVar7,-1);
    pSVar4 = (res->super_SQObject)._unVal.pTable;
    SVar2 = (res->super_SQObject)._type;
    (res->super_SQObject)._type = OT_STRING;
    (res->super_SQObject)._unVal.pString = pSVar9;
    pSVar1 = &(pSVar9->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  else {
    if (0xa00007f < (int)SVar2) {
      if ((SVar2 == OT_USERDATA) || (SVar2 == OT_INSTANCE)) {
LAB_0015b0a1:
        pSVar4 = (o->super_SQObject)._unVal.pTable;
        if ((pSVar4->super_SQDelegable)._delegate != (SQTable *)0x0) {
          local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
          local_38.super_SQObject._type = OT_NULL;
          iVar6 = (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _vptr_SQRefCounted[6])(pSVar4,this,0xf);
          if ((char)iVar6 == '\0') {
LAB_0015b109:
            bVar5 = true;
          }
          else {
            Push(this,o);
            bVar5 = CallMetaMethod(this,&local_38,mm,1,res);
            if (bVar5) {
              if ((res->super_SQObject)._type != OT_STRING) goto LAB_0015b109;
              unaff_BPL = 1;
            }
            else {
              unaff_BPL = 0;
            }
            bVar5 = false;
          }
          SQObjectPtr::~SQObjectPtr(&local_38);
          if (!bVar5) goto LAB_0015b250;
        }
      }
LAB_0015b1c3:
      pSVar7 = SQSharedState::GetScratchPad(this->_sharedstate,0x42);
      pSVar8 = GetTypeName(o);
      snprintf(pSVar7,0x42,"(%s : 0x%p)",pSVar8,(o->super_SQObject)._unVal.pTable);
      goto LAB_0015b1fc;
    }
    if (SVar2 != OT_STRING) {
      if (SVar2 == OT_TABLE) goto LAB_0015b0a1;
      goto LAB_0015b1c3;
    }
    SVar2 = (res->super_SQObject)._type;
    pSVar4 = (res->super_SQObject)._unVal.pTable;
    (res->super_SQObject)._unVal = (o->super_SQObject)._unVal;
    SVar3 = (o->super_SQObject)._type;
    (res->super_SQObject)._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
  }
  unaff_BPL = 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    unaff_BPL = 1;
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      unaff_BPL = 1;
    }
  }
LAB_0015b250:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool SQVM::ToString(const SQObjectPtr &o,SQObjectPtr &res)
{
    switch(sq_type(o)) {
    case OT_STRING:
        res = o;
        return true;
    case OT_FLOAT:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR),_SC("%g"),_float(o));
        break;
    case OT_INTEGER:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR),_PRINT_INT_FMT,_integer(o));
        break;
    case OT_BOOL:
        scsprintf(_sp(sq_rsl(6)),sq_rsl(6),_integer(o)?_SC("true"):_SC("false"));
        break;
    case OT_TABLE:
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o)->_delegate) {
            SQObjectPtr closure;
            if(_delegable(o)->GetMetaMethod(this, MT_TOSTRING, closure)) {
                Push(o);
                if(CallMetaMethod(closure,MT_TOSTRING,1,res)) {
                    if(sq_type(res) == OT_STRING)
                        return true;
                }
                else {
                    return false;
                }
            }
        }
    default:
        scsprintf(_sp(sq_rsl((sizeof(void*)*2)+NUMBER_MAX_CHAR)),sq_rsl((sizeof(void*)*2)+NUMBER_MAX_CHAR),_SC("(%s : 0x%p)"),GetTypeName(o),(void*)_rawval(o));
    }
    res = SQString::Create(_ss(this),_spval);
    return true;
}